

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DrawMeshIndirect
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,DrawMeshIndirectAttribs *Attribs,
          int param_2)

{
  String *__return_storage_ptr__;
  DRAW_FLAGS DVar1;
  bool bVar2;
  COMMAND_QUEUE_TYPE CVar3;
  DRAW_COMMAND_CAP_FLAGS DVar4;
  Char *pCVar5;
  RenderDeviceVkImpl *pRVar6;
  DeviceFeatures *pDVar7;
  GraphicsAdapterInfo *pGVar8;
  PipelineStateVkImpl *pPVar9;
  PipelineStateDesc *pPVar10;
  COMMAND_QUEUE_TYPE Type;
  char *in_R8;
  char (*in_R9) [8];
  undefined1 local_150 [8];
  string msg_7;
  string msg_6;
  string msg_5;
  string msg_4;
  string msg_3;
  undefined1 local_90 [8];
  string msg_2;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  int param_2_local;
  DrawMeshIndirectAttribs *Attribs_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._12_4_ = param_2;
  DVar1 = Diligent::operator&(Attribs->Flags,DRAW_FLAG_VERIFY_DRAW_ATTRIBS);
  if (DVar1 != DRAW_FLAG_NONE) {
    if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
      bVar2 = IsDeferred(this);
      if (!bVar2) {
        FormatString<char[79]>
                  ((string *)local_40,
                   (char (*) [79])
                   "Queue type may never be unknown for immediate contexts. This looks like a bug.")
        ;
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar5,"DrawMeshIndirect",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x95c);
        std::__cxx11::string::~string((string *)local_40);
      }
      FormatString<char[97]>
                ((string *)((long)&msg_2.field_2 + 8),
                 (char (*) [97])
                 "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
                );
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"DrawMeshIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x95c);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
    CVar3 = Diligent::operator&((this->m_Desc).QueueType,COMMAND_QUEUE_TYPE_GRAPHICS);
    if (CVar3 != COMMAND_QUEUE_TYPE_GRAPHICS) {
      __return_storage_ptr__ = (String *)((long)&msg_3.field_2 + 8);
      GetCommandQueueTypeString_abi_cxx11_
                (__return_storage_ptr__,(Diligent *)(ulong)(this->m_Desc).QueueType,Type);
      in_R8 = " queue.";
      FormatString<char[17],char[22],std::__cxx11::string,char[8]>
                ((string *)local_90,(Diligent *)"DrawMeshIndirect",(char (*) [17])0xcc2999,
                 (char (*) [22])__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",
                 in_R9);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"DrawMeshIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x95c);
      std::__cxx11::string::~string((string *)local_90);
    }
    pRVar6 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->(&this->m_pDevice);
    pDVar7 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetFeatures
                       ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)pRVar6);
    if (pDVar7->MeshShaders == DEVICE_FEATURE_STATE_DISABLED) {
      FormatString<char[64]>
                ((string *)((long)&msg_4.field_2 + 8),
                 (char (*) [64])"DrawMeshIndirect: mesh shaders are not supported by this device");
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"DrawMeshIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x95e);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
    }
    if (Attribs->pCounterBuffer != (IBuffer *)0x0) {
      pRVar6 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->(&this->m_pDevice);
      pGVar8 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetAdapterInfo
                         ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)pRVar6);
      DVar4 = Diligent::operator&((pGVar8->DrawCommand).CapFlags,
                                  DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER);
      if (DVar4 == DRAW_COMMAND_CAP_FLAG_NONE) {
        FormatString<char[134]>
                  ((string *)((long)&msg_5.field_2 + 8),
                   (char (*) [134])
                   "DrawMeshIndirect command arguments are invalid: counter buffer requires DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER capability"
                  );
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar5,"DrawMeshIndirect",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x961);
        std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
      }
    }
    bVar2 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator!(&this->m_pPipelineState);
    if (bVar2) {
      FormatString<char[76]>
                ((string *)((long)&msg_6.field_2 + 8),
                 (char (*) [76])
                 "DrawMeshIndirect command arguments are invalid: no pipeline state is bound.");
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"DrawMeshIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x964);
      std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
    }
    pPVar9 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->(&this->m_pPipelineState);
    pPVar10 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetDesc
                        (&pPVar9->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    if (pPVar10->PipelineType != PIPELINE_TYPE_MESH) {
      pPVar9 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->(&this->m_pPipelineState);
      pPVar10 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetDesc
                          (&pPVar9->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
      FormatString<char[65],char_const*,char[26]>
                ((string *)((long)&msg_7.field_2 + 8),
                 (Diligent *)"DrawMeshIndirect command arguments are invalid: pipeline state \'",
                 (char (*) [65])pPVar10,(char **)"\' is not a mesh pipeline.",(char (*) [26])in_R8);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"DrawMeshIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x968);
      std::__cxx11::string::~string((string *)(msg_7.field_2._M_local_buf + 8));
    }
    bVar2 = VerifyDrawMeshIndirectAttribs(Attribs,0xc);
    if (!bVar2) {
      FormatString<char[36]>
                ((string *)local_150,(char (*) [36])"DrawMeshIndirectAttribs are invalid");
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"DrawMeshIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x96a);
      std::__cxx11::string::~string((string *)local_150);
    }
  }
  (this->m_Stats).CommandCounters.DrawMeshIndirect =
       (this->m_Stats).CommandCounters.DrawMeshIndirect + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::DrawMeshIndirect(const DrawMeshIndirectAttribs& Attribs, int)
{
#ifdef DILIGENT_DEVELOPMENT
    if ((Attribs.Flags & DRAW_FLAG_VERIFY_DRAW_ATTRIBS) != 0)
    {
        DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "DrawMeshIndirect");

        DEV_CHECK_ERR(m_pDevice->GetFeatures().MeshShaders, "DrawMeshIndirect: mesh shaders are not supported by this device");

        DEV_CHECK_ERR(Attribs.pCounterBuffer == nullptr || (m_pDevice->GetAdapterInfo().DrawCommand.CapFlags & DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER) != 0,
                      "DrawMeshIndirect command arguments are invalid: counter buffer requires DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER capability");
        // There is no need to check DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT because an indirect buffer can only be created if this capability is supported.

        DEV_CHECK_ERR(m_pPipelineState, "DrawMeshIndirect command arguments are invalid: no pipeline state is bound.");

        DEV_CHECK_ERR(m_pPipelineState->GetDesc().PipelineType == PIPELINE_TYPE_MESH,
                      "DrawMeshIndirect command arguments are invalid: pipeline state '",
                      m_pPipelineState->GetDesc().Name, "' is not a mesh pipeline.");

        DEV_CHECK_ERR(VerifyDrawMeshIndirectAttribs(Attribs, DrawMeshIndirectCommandStride), "DrawMeshIndirectAttribs are invalid");
    }
#endif
    ++m_Stats.CommandCounters.DrawMeshIndirect;
}